

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O1

void __thiscall
capnp::compiler::CompilerMain::ParseErrorCatcher::ParseErrorCatcher
          (ParseErrorCatcher *this,ProcessContext *context)

{
  kj::ExceptionCallback::ExceptionCallback(&this->super_ExceptionCallback);
  (this->super_ExceptionCallback)._vptr_ExceptionCallback =
       (_func_int **)&PTR__ParseErrorCatcher_00289958;
  this->context = context;
  (this->exception).ptr.isSet = false;
  kj::UnwindDetector::UnwindDetector(&this->unwindDetector);
  return;
}

Assistant:

ParseErrorCatcher(kj::ProcessContext& context): context(context) {}